

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCut.c
# Opt level: O0

void Dar_ObjCutPrint(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int local_24;
  Dar_Cut_t *pDStack_20;
  int i;
  Dar_Cut_t *pCut;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  printf("Cuts for node %d:\n",(ulong)(uint)pObj->Id);
  pDStack_20 = Dar_ObjCuts(pObj);
  for (local_24 = 0; local_24 < (int)(uint)(byte)((ulong)*(undefined8 *)&pObj->field_0x18 >> 0x38);
      local_24 = local_24 + 1) {
    if ((*(uint *)&pDStack_20->field_0x4 >> 0x1c & 1) != 0) {
      Dar_CutPrint(pDStack_20);
    }
    pDStack_20 = pDStack_20 + 1;
  }
  return;
}

Assistant:

void Dar_ObjCutPrint( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Dar_Cut_t * pCut;
    int i;
    printf( "Cuts for node %d:\n", pObj->Id );
    Dar_ObjForEachCut( pObj, pCut, i )
        Dar_CutPrint( pCut );
//    printf( "\n" );
}